

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O3

double __thiscall SharedMatting::nP(SharedMatting *this,int i,int j,Scalar *f,Scalar *b)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  Scalar local_78;
  Scalar local_58;
  
  iVar6 = 1;
  if (1 < i) {
    iVar6 = i;
  }
  iVar7 = this->height + -1;
  if (i + 1 <= iVar7) {
    iVar7 = i + 1;
  }
  iVar3 = 1;
  if (1 < j) {
    iVar3 = j;
  }
  dVar2 = 0.0;
  if (iVar6 + -1 <= iVar7) {
    iVar4 = this->width + -1;
    iVar5 = j + 1;
    if (iVar4 < j + 1) {
      iVar5 = iVar4;
    }
    iVar6 = iVar6 + -1;
    dVar2 = 0.0;
    do {
      iVar4 = iVar3 + -1;
      if (iVar3 + -1 <= iVar5) {
        do {
          local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (f->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (f->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (f->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (f->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          local_78.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (b->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_78.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (b->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_78.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (b->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_78.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (b->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          dVar1 = mP(this,iVar6,iVar4,&local_58,&local_78);
          dVar2 = dVar2 + dVar1 * dVar1;
          bVar8 = iVar4 != iVar5;
          iVar4 = iVar4 + 1;
        } while (bVar8);
      }
      bVar8 = iVar6 < iVar7;
      iVar6 = iVar6 + 1;
    } while (bVar8);
  }
  return dVar2;
}

Assistant:

double SharedMatting::nP(int i, int j, Scalar f, Scalar b)
{
    int i1 = max(0, i - 1);
    int i2 = min(i + 1, height - 1);
    int j1 = max(0, j - 1);
    int j2 = min(j + 1, width - 1);

    double  result = 0;

    for (int k = i1; k <= i2; ++k)
    {
        for (int l = j1; l <= j2; ++l)
        {
            double m = mP(k, l, f, b);
            result += m * m;
        }
    }

    return result;
}